

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CFieldList *stm)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  CError local_80;
  TypeInfo local_50;
  pointer local_28;
  pointer field;
  int index;
  bool areAllFieldsBuilt;
  CFieldList *stm_local;
  CTypeCheckerVisitor *this_local;
  
  _index = stm;
  stm_local = (CFieldList *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: fieldlist\n");
  field._7_1_ = 1;
  field._0_4_ = 0;
  do {
    uVar1 = (ulong)(int)field;
    sVar2 = std::
            vector<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
            ::size(&_index->fields);
    if (sVar2 <= uVar1) {
LAB_00143268:
      if ((field._7_1_ & 1) == 0) {
        CError::CError(&local_80,(string *)CError::AST_ERROR_abi_cxx11_,
                       &(_index->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_80);
        CError::~CError(&local_80);
      }
      else {
        TypeInfo::TypeInfo(&local_50,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_50);
        TypeInfo::~TypeInfo(&local_50);
      }
      return;
    }
    this_00 = std::
              vector<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
              ::operator[](&_index->fields,(long)(int)field);
    local_28 = std::unique_ptr<CField,_std::default_delete<CField>_>::get(this_00);
    if (local_28 == (pointer)0x0) {
      field._7_1_ = 0;
      goto LAB_00143268;
    }
    (**(local_28->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(local_28,this);
    field._0_4_ = (int)field + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CFieldList &stm ) 
{
	std::cout << "typechecker: fieldlist\n";
    bool areAllFieldsBuilt = true;
    for (int index = 0; index < stm.fields.size(); ++index) {
        auto field = stm.fields[index].get();
        if( !field ) {
            areAllFieldsBuilt = false;
            break;
        }
        field->Accept( *this );
    }
    if( areAllFieldsBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}